

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

Matrix_t Inv4(Matrix_t sMatrix)

{
  long lVar1;
  float fVar2;
  Matrix_t MVar3;
  float *local_68;
  float *local_60;
  int local_54;
  int local_50;
  int y;
  int x;
  float det;
  Matrix_t mat_err;
  Matrix_t cp_mat;
  Matrix_t sMatrix_local;
  float *local_10;
  
  sMatrix_local.pMatrix._0_1_ = sMatrix.row;
  sMatrix_local.pMatrix._1_1_ = sMatrix.column;
  memset(&x,0,0x10);
  MVar3 = Companion_Mat4(sMatrix);
  local_68 = MVar3.pMatrix;
  mat_err._8_8_ = local_68;
  local_60 = MVar3._8_8_;
  fVar2 = Det4(sMatrix);
  if (((uint8_t)sMatrix_local.pMatrix == '\x04') && (sMatrix_local.pMatrix._1_1_ == '\x04')) {
    for (local_50 = 0; local_50 < 4; local_50 = local_50 + 1) {
      for (local_54 = 0; local_54 < 4; local_54 = local_54 + 1) {
        lVar1 = mat_err._8_8_ + (long)(local_50 << 2) * 4;
        *(float *)(lVar1 + (long)local_54 * 4) = *(float *)(lVar1 + (long)local_54 * 4) / fVar2;
      }
    }
    sMatrix_local.row = mat_err.row;
    sMatrix_local.column = mat_err.column;
    sMatrix_local._10_6_ = mat_err._10_6_;
    local_10 = local_60;
  }
  else {
    printf("ERROR: Cannot calculate inverse matrix, matrix must be a 4x4 square matrix!\n");
    sMatrix_local.row = (uint8_t)x;
    sMatrix_local.column = x._1_1_;
    sMatrix_local._10_6_ = stack0xffffffffffffffba;
    local_10 = mat_err.pMatrix;
  }
  MVar3._8_8_ = local_10;
  MVar3.pMatrix = (float *)sMatrix_local._8_8_;
  return MVar3;
}

Assistant:

Matrix_t Inv4(Matrix_t sMatrix)
{
	Matrix_t cp_mat;
	Matrix_t mat_err = {NULL, 0, 0};
	float det;
	int x, y;
	cp_mat = Companion_Mat4(sMatrix);			 //求伴随矩阵
	det = Det4(sMatrix);						 //求矩阵行列式
	if (sMatrix.row == 4 && sMatrix.column == 4) //(A^-1) = 1/|A|*(A*)
	{
		for (x = 0; x < 4; x++)
		{
			for (y = 0; y < 4; y++)
			{
				*(cp_mat.pMatrix + x * 4 + y) /= det;
			}
		}
		return cp_mat;
	}
	else
	{
		printf("ERROR: Cannot calculate inverse matrix, matrix must be a 4x4 square matrix!\n");
		return mat_err;
	}
}